

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void dc_store_32xh(uint16_t *dst,ptrdiff_t stride,int height,__m128i *dc)

{
  int iVar1;
  uint16_t *puVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  
  auVar5 = pshuflw(in_XMM0,(undefined1  [16])*dc,0);
  uVar4 = auVar5._0_4_;
  iVar1 = 0;
  if (0 < height) {
    iVar1 = height;
  }
  puVar2 = dst + 0x18;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    *(undefined4 *)(puVar2 + -0x18) = uVar4;
    *(undefined4 *)(puVar2 + -0x16) = uVar4;
    *(undefined4 *)(puVar2 + -0x14) = uVar4;
    *(undefined4 *)(puVar2 + -0x12) = uVar4;
    *(undefined4 *)(puVar2 + -0x10) = uVar4;
    *(undefined4 *)(puVar2 + -0xe) = uVar4;
    *(undefined4 *)(puVar2 + -0xc) = uVar4;
    *(undefined4 *)(puVar2 + -10) = uVar4;
    *(undefined4 *)(puVar2 + -8) = uVar4;
    *(undefined4 *)(puVar2 + -6) = uVar4;
    *(undefined4 *)(puVar2 + -4) = uVar4;
    *(undefined4 *)(puVar2 + -2) = uVar4;
    *(undefined4 *)puVar2 = uVar4;
    *(undefined4 *)(puVar2 + 2) = uVar4;
    *(undefined4 *)(puVar2 + 4) = uVar4;
    *(undefined4 *)(puVar2 + 6) = uVar4;
    puVar2 = puVar2 + stride;
  }
  return;
}

Assistant:

static inline void dc_store_32xh(uint16_t *dst, ptrdiff_t stride, int height,
                                 const __m128i *dc) {
  const __m128i dc_dup_lo = _mm_shufflelo_epi16(*dc, 0);
  const __m128i dc_dup = _mm_unpacklo_epi64(dc_dup_lo, dc_dup_lo);
  int i;
  for (i = 0; i < height; ++i, dst += stride) {
    _mm_store_si128((__m128i *)dst, dc_dup);
    _mm_store_si128((__m128i *)(dst + 8), dc_dup);
    _mm_store_si128((__m128i *)(dst + 16), dc_dup);
    _mm_store_si128((__m128i *)(dst + 24), dc_dup);
  }
}